

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_cppcheck.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_20;
  int local_1c;
  int result;
  int i;
  char **argv_local;
  int argc_local;
  
  local_20 = 0;
  local_1c = 1;
  while( true ) {
    if (argc <= local_1c) {
      fprintf(_stderr,
              "[/foo/bar.c:2]: (error) Array \'abc[10]\' accessed at index 12, which is out of bounds.\n"
             );
      fprintf(_stderr,
              "[/foo/bar.c:2]: (warning) Member variable \'foo::bar\' is not initialized in the constructor.\n"
             );
      fprintf(_stderr,"[/foo/bar.c:2]: (style) C-style pointer casting.\n");
      fprintf(_stderr,
              "[/foo/bar.c:2]: (performance) Variable \'m_message\' is assigned in constructor body. Consider performing initialization in initialization list.\n"
             );
      fprintf(_stderr,
              "[/foo/bar.c:2]: (portability) scanf without field width limits can crash with huge input data on some versions of libc\n"
             );
      fprintf(_stderr,
              "[/foo/bar.c:2]: (information) cannot find all the include files (use --check-config for details)\n"
             );
      return local_20;
    }
    iVar1 = strcmp(argv[local_1c],"-bad");
    if (iVar1 == 0) break;
    iVar1 = strcmp(argv[local_1c],"-error");
    if (iVar1 == 0) {
      local_20 = 5;
    }
    local_1c = local_1c + 1;
  }
  fprintf(_stdout,"stdout from bad command line arg \'-bad\'\n");
  fprintf(_stderr,"stderr from bad command line arg \'-bad\'\n");
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int result = 0;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    } else if (strcmp(argv[i], "-error") == 0) {
      // The real cppcheck allows to set the exitcode with --error-exitcode
      result = 5;
    }
  }
  fprintf(stderr,
          "[/foo/bar.c:2]: (error) Array 'abc[10]' accessed at index 12,"
          " which is out of bounds.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (warning) Member variable 'foo::bar' is "
          "not initialized in the constructor.\n");
  fprintf(stderr, "[/foo/bar.c:2]: (style) C-style pointer casting.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (performance) Variable 'm_message' is "
          "assigned in constructor body. Consider performing "
          "initialization in initialization list.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (portability) scanf without field width "
          "limits can crash with huge input data on some versions of "
          "libc\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (information) cannot find all the include "
          "files (use --check-config for details)\n");

  return result;
}